

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.hpp
# Opt level: O2

void __thiscall boost::uuids::detail::sha1::process_block(sha1 *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_t i;
  long lVar6;
  uint uVar7;
  size_t i_1;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint auStack_1b8 [8];
  uint auStack_198 [8];
  uint auStack_178 [82];
  
  for (lVar6 = 5; lVar6 != 0x15; lVar6 = lVar6 + 1) {
    uVar7 = this->h_[lVar6];
    auStack_198[lVar6 + 3] =
         uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  }
  for (lVar6 = 0x10; lVar6 != 0x50; lVar6 = lVar6 + 1) {
    uVar7 = auStack_198[lVar6] ^ auStack_198[lVar6 + 5] ^ auStack_1b8[lVar6 + 2] ^
            auStack_1b8[lVar6];
    auStack_198[lVar6 + 8] = uVar7 << 1 | (uint)((int)uVar7 < 0);
  }
  uVar7 = this->h_[1];
  uVar1 = this->h_[2];
  uVar2 = this->h_[3];
  uVar3 = this->h_[4];
  uVar15 = this->h_[0];
  uVar9 = uVar7;
  uVar14 = uVar1;
  uVar12 = uVar2;
  uVar10 = uVar3;
  for (uVar8 = 0; uVar11 = uVar12, uVar12 = uVar14, uVar14 = uVar15, uVar8 != 0x50;
      uVar8 = uVar8 + 1) {
    if (uVar8 < 0x14) {
      uVar15 = (uVar12 ^ uVar11) & uVar9 ^ uVar11;
      iVar13 = 0x5a827999;
    }
    else if (uVar8 < 0x28) {
      uVar15 = uVar12 ^ uVar9 ^ uVar11;
      iVar13 = 0x6ed9eba1;
    }
    else if (uVar8 < 0x3c) {
      uVar15 = uVar11 & uVar12 | (uVar11 | uVar12) & uVar9;
      iVar13 = -0x70e44324;
    }
    else {
      uVar15 = uVar12 ^ uVar9 ^ uVar11;
      iVar13 = -0x359d3e2a;
    }
    lVar6 = uVar8 + 8;
    uVar4 = uVar9 << 0x1e;
    uVar5 = uVar9 >> 2;
    uVar15 = uVar10 + (uVar14 << 5 | uVar14 >> 0x1b) + uVar15 + iVar13 + auStack_198[lVar6];
    uVar9 = uVar14;
    uVar14 = uVar4 | uVar5;
    uVar10 = uVar11;
  }
  this->h_[0] = uVar14 + this->h_[0];
  this->h_[1] = uVar9 + uVar7;
  this->h_[2] = uVar12 + uVar1;
  this->h_[3] = uVar11 + uVar2;
  this->h_[4] = uVar10 + uVar3;
  return;
}

Assistant:

inline void sha1::process_block()
{
    unsigned int w[80];
    for (std::size_t i=0; i<16; ++i) {
        w[i]  = (block_[i*4 + 0] << 24);
        w[i] |= (block_[i*4 + 1] << 16);
        w[i] |= (block_[i*4 + 2] << 8);
        w[i] |= (block_[i*4 + 3]);
    }
    for (std::size_t i=16; i<80; ++i) {
        w[i] = left_rotate((w[i-3] ^ w[i-8] ^ w[i-14] ^ w[i-16]), 1);
    }

    unsigned int a = h_[0];
    unsigned int b = h_[1];
    unsigned int c = h_[2];
    unsigned int d = h_[3];
    unsigned int e = h_[4];

    for (std::size_t i=0; i<80; ++i) {
        unsigned int f;
        unsigned int k;

        if (i<20) {
            f = (b & c) | (~b & d);
            k = 0x5A827999;
        } else if (i<40) {
            f = b ^ c ^ d;
            k = 0x6ED9EBA1;
        } else if (i<60) {
            f = (b & c) | (b & d) | (c & d);
            k = 0x8F1BBCDC;
        } else {
            f = b ^ c ^ d;
            k = 0xCA62C1D6;
        }

        unsigned temp = left_rotate(a, 5) + f + e + k + w[i];
        e = d;
        d = c;
        c = left_rotate(b, 30);
        b = a;
        a = temp;
    }

    h_[0] += a;
    h_[1] += b;
    h_[2] += c;
    h_[3] += d;
    h_[4] += e;
}